

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::AddStripRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_00;
  string *psVar2;
  bool bVar3;
  TargetType TVar4;
  cmMakefile *pcVar5;
  string *psVar6;
  ostream *poVar7;
  Indent IVar8;
  string stripArgs;
  string local_98;
  string local_78;
  string *local_58;
  string local_50;
  
  TVar4 = cmGeneratorTarget::GetType(this->Target);
  if ((TVar4 != STATIC_LIBRARY) && (this->ImportLibrary == false)) {
    local_58 = toDestDirPath;
    pcVar5 = cmTarget::GetMakefile(this->Target->Target);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"APPLE","");
    bVar3 = cmMakefile::IsOn(pcVar5,&local_98);
    if (bVar3) {
      this_00 = this->Target;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MACOSX_BUNDLE","");
      bVar3 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
    if (bVar3 == false) {
      pcVar5 = cmTarget::GetMakefile(this->Target->Target);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CMAKE_STRIP","");
      bVar3 = cmMakefile::IsSet(pcVar5,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                 local_98.field_2._M_local_buf[0]) + 1);
      }
      if (bVar3) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        local_98._M_string_length = 0;
        local_98.field_2._M_local_buf[0] = '\0';
        pcVar5 = cmTarget::GetMakefile(this->Target->Target);
        paVar1 = &local_78.field_2;
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"APPLE","");
        bVar3 = cmMakefile::IsOn(pcVar5,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (bVar3) {
          TVar4 = cmGeneratorTarget::GetType(this->Target);
          if ((TVar4 == SHARED_LIBRARY) ||
             (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == MODULE_LIBRARY)) {
            std::__cxx11::string::_M_replace
                      ((ulong)&local_98,0,(char *)local_98._M_string_length,0x7a3814);
          }
          else {
            TVar4 = cmGeneratorTarget::GetType(this->Target);
            if (TVar4 == EXECUTABLE) {
              std::__cxx11::string::operator=((string *)&local_98,"-u -r ");
            }
          }
        }
        IVar8.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar8.Level = IVar8.Level + -1;
          } while (IVar8.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"if(CMAKE_INSTALL_DO_STRIP)\n",0x1b);
        IVar8.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar8.Level = IVar8.Level + -1;
          } while (IVar8.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  execute_process(COMMAND \"",0x1b);
        pcVar5 = cmTarget::GetMakefile(this->Target->Target);
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CMAKE_STRIP","");
        psVar6 = cmMakefile::GetSafeDefinition(pcVar5,&local_78);
        psVar2 = local_58;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_98._M_dataplus._M_p,local_98._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            indent.Level = indent.Level + -1;
          } while (indent.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddStripRule(std::ostream& os, Indent indent,
                                            const std::string& toDestDirPath)
{

  // don't strip static and import libraries, because it removes the only
  // symbol table they have so you can't link to them anymore
  if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
      this->ImportLibrary) {
    return;
  }

  // Don't handle OSX Bundles.
  if (this->Target->Target->GetMakefile()->IsOn("APPLE") &&
      this->Target->GetPropertyAsBool("MACOSX_BUNDLE")) {
    return;
  }

  if (!this->Target->Target->GetMakefile()->IsSet("CMAKE_STRIP")) {
    return;
  }

  std::string stripArgs;

  // macOS 'strip' is picky, executables need '-u -r' and dylibs need '-x'.
  if (this->Target->Target->GetMakefile()->IsOn("APPLE")) {
    if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) {
      stripArgs = "-x ";
    } else if (this->Target->GetType() == cmStateEnums::EXECUTABLE) {
      stripArgs = "-u -r ";
    }
  }

  os << indent << "if(CMAKE_INSTALL_DO_STRIP)\n";
  os << indent << "  execute_process(COMMAND \""
     << this->Target->Target->GetMakefile()->GetSafeDefinition("CMAKE_STRIP")
     << "\" " << stripArgs << "\"" << toDestDirPath << "\")\n";
  os << indent << "endif()\n";
}